

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

int __thiscall mpt::layout::graph::transform3::dimensions(transform3 *this)

{
  float fVar1;
  uint uVar2;
  
  uVar2 = 3;
  if (((this->_dim[2].super_value_apply.to.super_point<float>.x == 0.0) &&
      (fVar1 = this->_dim[2].super_value_apply.to.super_point<float>.y, fVar1 == 0.0)) &&
     (!NAN(fVar1))) {
    fVar1 = this->_dim[1].super_value_apply.to.super_point<float>.x;
    uVar2 = 2;
    if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
       ((fVar1 = this->_dim[1].super_value_apply.to.super_point<float>.y, fVar1 == 0.0 &&
        (!NAN(fVar1))))) {
      uVar2 = -(uint)(this->_dim[0].super_value_apply.to.super_point<float>.x != 0.0 ||
                     this->_dim[0].super_value_apply.to.super_point<float>.y != 0.0) & 1;
    }
  }
  return uVar2;
}

Assistant:

int layout::graph::transform3::dimensions() const
{
	if (_dim[2].to.x || _dim[2].to.y) {
		return 3;
	}
	if (_dim[1].to.x || _dim[1].to.y) {
		return 2;
	}
	if (_dim[0].to.x || _dim[0].to.y) {
		return 1;
	}
	return 0;
}